

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_output.cpp
# Opt level: O0

void test_input_modifiers(void)

{
  istream *piVar1;
  ostream *poVar2;
  int local_18;
  int local_14;
  int d;
  int c;
  int b;
  int a;
  
  std::operator<<((ostream *)&std::cout,"Enter four integers:\n");
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&c);
  piVar1 = (istream *)std::istream::operator>>(piVar1,std::oct);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&d);
  piVar1 = (istream *)std::istream::operator>>(piVar1,std::hex);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&local_14);
  std::istream::operator>>(piVar1,&local_18);
  std::ostream::operator<<((ostream *)&std::cout,std::dec);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,c);
  poVar2 = std::operator<<(poVar2,'\t');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,d);
  poVar2 = std::operator<<(poVar2,'\t');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  poVar2 = std::operator<<(poVar2,'\t');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void test_input_modifiers()
{
	std::cout << "Enter four integers:\n";
	int a, b, c, d;
	std::cin >> a >> std::oct >> b >> std::hex >> c >> d;
	std::cout << std::dec;
	// outputs 1234    668     4660    4660
	// because input to a was read as decimal
	// input to b was read as octal
	// input to c and d was read as hexadecimal
	std::cout << a << '\t' << b << '\t' << c << '\t' << d << '\n';
}